

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::MixTest::MixTest
          (MixTest *this,Context *context,FboConfig *config,bool npot)

{
  char *pcVar1;
  int iVar2;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  FboConfig *pFStack_20;
  bool npot_local;
  FboConfig *config_local;
  Context *context_local;
  MixTest *this_local;
  
  pcVar1 = "mix_";
  if (npot) {
    pcVar1 = "mix_npot_";
  }
  local_21 = npot;
  pFStack_20 = config;
  config_local = (FboConfig *)context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar1,&local_69);
  FboConfig::getName_abi_cxx11_(&local_a0,pFStack_20);
  std::operator+(&local_48,&local_68,&local_a0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,pcVar1,"Use two fbos as sources in draw operation",
             pFStack_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MixTest_03291b10;
  iVar2 = 0x80;
  if ((local_21 & 1) != 0) {
    iVar2 = 0x7f;
  }
  this->m_fboAWidth = iVar2;
  iVar2 = 0x80;
  if ((local_21 & 1) != 0) {
    iVar2 = 0x5f;
  }
  this->m_fboAHeight = iVar2;
  iVar2 = 0x40;
  if ((local_21 & 1) != 0) {
    iVar2 = 0x37;
  }
  this->m_fboBWidth = iVar2;
  iVar2 = 0x40;
  if ((local_21 & 1) != 0) {
    iVar2 = 0x3f;
  }
  this->m_fboBHeight = iVar2;
  return;
}

Assistant:

MixTest::MixTest (Context& context, const FboConfig& config, bool npot)
	: FboRenderCase	(context, (string(npot ? "mix_npot_" : "mix_") + config.getName()).c_str(), "Use two fbos as sources in draw operation", config)
	, m_fboAWidth	(npot ? 127 : 128)
	, m_fboAHeight	(npot ?  95 : 128)
	, m_fboBWidth	(npot ?  55 :  64)
	, m_fboBHeight	(npot ?  63 :  64)
{
}